

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall
GlobOpt::TypeSpecializeIntUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,int32 min,int32 max,
          Value *src1OriginalVal,bool *redoTypeSpecRef,bool skipDst)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  uint7 uVar15;
  IndirOpnd *pIVar11;
  IntConstOpnd *pIVar12;
  AddSubConstantInfo *addSubConstantInfo_00;
  char16 *pcVar13;
  Value *pVVar14;
  uint uVar16;
  ulong uVar17;
  Value **pDstVal_00;
  Instr *pIVar18;
  undefined4 uVar19;
  undefined8 extraout_RDX;
  Value *src1Value;
  byte bVar20;
  byte bVar21;
  OpCode OVar22;
  uint uVar23;
  Value *local_98;
  Value *src2Val;
  AddSubConstantInfo addSubConstantInfo;
  undefined1 local_70 [8];
  anon_class_16_2_639d4b01 CannotOverflowBasedOnRelativeBounds;
  BailOutKind local_40;
  
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1f87,"(pSrc1Val)","pSrc1Val");
    if (!bVar3) goto LAB_00437fe8;
    *puVar9 = 0;
  }
  bVar21 = this->field_0xf4;
  bVar3 = IR::Opnd::IsRegOpnd((*pInstr)->m_src1);
  if ((bVar3) &&
     (pRVar10 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1), (pRVar10->m_sym->field_0x18 & 2) != 0)) {
    return false;
  }
  bVar21 = bVar21 >> 2;
  src2Val = (Value *)0x0;
  bVar20 = bVar21 & 1;
  pIVar18 = *pInstr;
  OVar1 = pIVar18->m_opcode;
  uVar17 = (ulong)(OVar1 - 0x43);
  uVar5 = min;
  uVar16 = max;
  addSubConstantInfo._16_8_ = pDstVal;
  if (OVar1 - 0x43 < 0x3c) {
    if ((0x8a8a00000400000U >> (uVar17 & 0x3f) & 1) != 0) {
      return false;
    }
    uVar15 = (uint7)(byte)(OVar1 >> 8);
    if (uVar17 == 0) {
      CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)CONCAT71(uVar15,1);
      OVar22 = Ld_I4;
      goto LAB_00437820;
    }
    if (uVar17 != 2) goto LAB_00437358;
    CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)CONCAT71(uVar15,1);
    OVar22 = Ld_I4;
    bVar3 = IR::Opnd::IsRegOpnd(pIVar18->m_src1);
    if (!bVar3) goto LAB_00437820;
    pRVar10 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
    bVar3 = GlobOptBlockData::IsInt32TypeSpecialized
                      (&this->currentBlock->globOptData,&pRVar10->m_sym->super_Sym);
    bVar4 = false;
    uVar6 = 0;
    local_40 = BailOutInvalid;
    if (!bVar3) {
      return false;
    }
    goto LAB_00437acd;
  }
LAB_00437358:
  pDstVal_00 = (Value **)(ulong)(OVar1 - 0x1ed);
  if (OVar1 - 0x1ed < 0x40) {
    if ((0xc79UL >> ((ulong)pDstVal_00 & 0x3f) & 1) != 0) {
      return false;
    }
    if (pDstVal_00 == (Value **)0x3f) goto LAB_0043750c;
  }
  pDstVal_00 = (Value **)(ulong)(OVar1 - 0x9a);
  if (OVar1 - 0x9a < 0x38) {
    if ((0xa0003000000000U >> ((ulong)pDstVal_00 & 0x3f) & 1) != 0) {
      return false;
    }
    if ((5UL >> ((ulong)pDstVal_00 & 0x3f) & 1) != 0) {
LAB_0043750c:
      pIVar11 = IR::Opnd::AsIndirOpnd(pIVar18->m_dst);
      local_70._0_2_ = (pIVar11->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
      bVar3 = ValueType::IsLikelyAnyArrayWithNativeFloatValues((ValueType *)local_70);
      if (bVar3) {
        *pSrc1Val = src1OriginalVal;
      }
      else {
        src1OriginalVal = *pSrc1Val;
      }
      bVar3 = TypeSpecializeStElem(this,pInstr,src1OriginalVal,pDstVal_00);
      return bVar3;
    }
  }
  switch(OVar1) {
  case Ret:
    goto switchD_00437390_caseD_24;
  case Yield:
switchD_00437390_caseD_25:
    bVar3 = OpCodeAttr::IsInlineBuiltIn(OVar1);
    if (!bVar3) {
      return false;
    }
    OVar22 = (*pInstr)->m_opcode;
    CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)0x0;
    goto LAB_00437820;
  case Incr_A:
    uVar5 = min + 1;
    local_70 = (undefined1  [8])pSrc1Val;
    CannotOverflowBasedOnRelativeBounds.src1Val = (Value **)this;
    if (SCARRY4(min,1)) {
      bVar3 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                        ((anon_class_16_2_639d4b01 *)local_70);
      uVar5 = 0x7fffffff;
      if (bVar3) goto LAB_004373bd;
      bVar3 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
      if (bVar3) {
        return false;
      }
LAB_004379d4:
      uVar5 = 0x80000000;
      uVar16 = 0x7fffffff;
      local_40 = BailOutInvalid;
      bVar20 = 1;
    }
    else {
LAB_004373bd:
      local_40 = BailOutInvalid;
      uVar16 = max + 1;
      if (SCARRY4(max,1)) {
        bVar3 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                          ((anon_class_16_2_639d4b01 *)local_70);
        uVar16 = 0x7fffffff;
        if (!bVar3) {
          bVar3 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
          if (!bVar3) goto LAB_004379d4;
          local_40 = BailOutOnOverflow;
          if ((this->field_0xf5 & 2) == 0) {
            return false;
          }
        }
      }
      if (((bVar21 & 1) == 0) && (bVar3 = IR::Opnd::IsRegOpnd((*pInstr)->m_src1), bVar3)) {
        pRVar10 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
        AddSubConstantInfo::Set
                  ((AddSubConstantInfo *)&src2Val,pRVar10->m_sym,*pSrc1Val,min == max,1);
      }
    }
    OVar22 = Add_I4;
    if (this->prePassLoop == (Loop *)0x0) {
      pIVar18 = *pInstr;
      pIVar12 = IR::IntConstOpnd::New(1,TyInt32,pIVar18->m_func,false);
      IR::Instr::SetSrc2(pIVar18,&pIVar12->super_Opnd);
      uVar6 = 0;
      OVar22 = Add_I4;
    }
    else {
LAB_004379fb:
      uVar6 = 0;
    }
    break;
  case Decr_A:
    uVar16 = max - 1;
    local_70 = (undefined1  [8])pSrc1Val;
    CannotOverflowBasedOnRelativeBounds.src1Val = (Value **)this;
    if (SBORROW4(max,1)) {
      bVar3 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                        ((anon_class_16_2_639d4b01 *)local_70);
      uVar16 = 0x80000000;
      if (bVar3) goto LAB_0043768c;
      bVar3 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
      if (bVar3) {
        return false;
      }
LAB_00437957:
      uVar5 = 0x80000000;
      uVar16 = 0x7fffffff;
      local_40 = BailOutInvalid;
      bVar20 = 1;
    }
    else {
LAB_0043768c:
      local_40 = BailOutInvalid;
      uVar5 = min - 1;
      if (SBORROW4(min,1)) {
        bVar3 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                          ((anon_class_16_2_639d4b01 *)local_70);
        uVar5 = 0x80000000;
        if (!bVar3) {
          bVar3 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
          if (!bVar3) goto LAB_00437957;
          local_40 = BailOutOnOverflow;
          if ((this->field_0xf5 & 2) == 0) {
            return false;
          }
        }
      }
      if (((bVar21 & 1) == 0) && (bVar3 = IR::Opnd::IsRegOpnd((*pInstr)->m_src1), bVar3)) {
        pRVar10 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
        AddSubConstantInfo::Set
                  ((AddSubConstantInfo *)&src2Val,pRVar10->m_sym,*pSrc1Val,min == max,-1);
      }
    }
    OVar22 = Sub_I4;
    if (this->prePassLoop != (Loop *)0x0) goto LAB_004379fb;
    pIVar18 = *pInstr;
    pIVar12 = IR::IntConstOpnd::New(1,TyInt32,pIVar18->m_func,false);
    IR::Instr::SetSrc2(pIVar18,&pIVar12->super_Opnd);
    uVar6 = 0;
    OVar22 = Sub_I4;
    break;
  case Neg_A:
    local_40 = BailOutInvalid;
    if (max < 0 || 0 < min) {
      uVar19 = 0;
    }
    else {
      bVar3 = IR::Instr::ShouldCheckForNegativeZero(pIVar18);
      uVar19 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      if (bVar3) {
        uVar19 = 0;
        if (max == 0 && min == 0) {
          return false;
        }
        local_40 = BailOutOnNegativeZero;
        if ((*(uint *)&this->field_0xf4 & 0x200) == 0) {
          return false;
        }
      }
    }
    CannotOverflowBasedOnRelativeBounds.this =
         (GlobOpt *)CONCAT44(CannotOverflowBasedOnRelativeBounds.this._4_4_,uVar19);
    uVar6 = -min;
    uVar23 = -max;
    bVar3 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
    uVar5 = 0x80000000;
    if ((int)uVar23 <= (int)uVar6 || bVar3) {
      uVar5 = uVar23;
    }
    uVar16 = 0x7fffffff;
    if ((int)uVar23 <= (int)uVar6 || bVar3) {
      uVar16 = uVar6;
    }
    OVar22 = Neg_I4;
    uVar6 = (uint)CannotOverflowBasedOnRelativeBounds.this;
    break;
  case Not_A:
    local_40 = BailOutInvalid;
    if ((this->field_0xf5 & 0x10) == 0) {
      return false;
    }
    uVar6 = ~min;
    uVar16 = ~max;
    uVar5 = uVar16;
    if ((int)uVar6 < (int)uVar16) {
      uVar5 = uVar6;
    }
    if ((int)uVar16 < (int)uVar6) {
      uVar16 = uVar6;
    }
    bVar4 = true;
    OVar22 = Not_I4;
    CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)0x0;
    goto LAB_00437acb;
  default:
    if (OVar1 - 0xe < 2) {
      bVar3 = DoConstFold(this);
      if (((bVar3) && (this->prePassLoop == (Loop *)0x0)) &&
         (bVar3 = TryOptConstFoldBrFalse(this,*pInstr,*pSrc1Val,min,max), bVar3)) {
        return true;
      }
      bVar3 = ValueInfo::HasIntConstantValue((*pSrc1Val)->valueInfo,false);
      bVar4 = true;
      if ((!bVar3) && (bVar3 = IR::Opnd::IsRegOpnd((*pInstr)->m_src1), bVar3)) {
        pRVar10 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
        bVar4 = GlobOptBlockData::IsInt32TypeSpecialized
                          (&this->currentBlock->globOptData,&pRVar10->m_sym->super_Sym);
      }
      if ((*pInstr)->m_opcode == BrTrue_A) {
        UpdateIntBoundsForNotEqualBranch(this,*pSrc1Val,(Value *)0x0,0);
        OVar22 = BrTrue_I4;
      }
      else {
        UpdateIntBoundsForEqualBranch(this,*pSrc1Val,(Value *)0x0,0);
        OVar22 = BrFalse_I4;
      }
      if (bVar4 == false) {
        return false;
      }
      CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)0x0;
      bVar4 = false;
      uVar6 = 0;
      local_40 = BailOutInvalid;
      uVar5 = 2;
      uVar16 = 1;
      goto LAB_00437acd;
    }
    if (OVar1 == MultiBr) {
      CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)0x0;
      OVar22 = MultiBr;
    }
    else {
      OVar22 = Ld_I4;
      if (OVar1 != LdC_A_I4) goto switchD_00437390_caseD_25;
      pIVar12 = IR::Opnd::AsIntConstOpnd(pIVar18->m_src1);
      uVar5 = IR::IntConstOpnd::AsInt32(pIVar12);
      CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)0x0;
      uVar16 = uVar5;
    }
LAB_00437820:
    local_40 = BailOutInvalid;
    uVar6 = 0;
    bVar4 = false;
    goto LAB_00437acd;
  }
  if (((char)uVar6 == '\0') && (bVar20 == 0)) {
    bVar3 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
    if (bVar3) {
      CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)0x0;
      bVar3 = IsWorthSpecializingToInt32(this,*pInstr,*pSrc1Val,(Value *)0x0);
      if (!bVar3) {
        pIVar18 = *pInstr;
        if (((local_40 == BailOutInvalid) && (pIVar18->m_dst != (Opnd *)0x0)) &&
           (((this->field_0xf5 & 2) != 0 || (this->prePassLoop == (Loop *)0x0)))) {
          pVVar14 = CreateDstUntransferredIntValue(this,uVar5,uVar16,pIVar18,*pSrc1Val,(Value *)0x0)
          ;
          *(Value **)addSubConstantInfo._16_8_ = pVVar14;
          pIVar18 = *pInstr;
        }
        if (pIVar18->m_src2 == (Opnd *)0x0) {
          return false;
        }
        IR::Instr::FreeSrc2(pIVar18);
        return false;
      }
    }
    else {
      CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)0x0;
    }
    bVar4 = false;
LAB_00437acb:
    uVar6 = 0;
  }
  else {
    CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)0x0;
    bVar4 = false;
  }
LAB_00437acd:
  *(uint *)&this->field_0xf4 =
       (uint)bVar20 * 4 + (uVar6 & 0xff) * 8 | *(uint *)&this->field_0xf4 & 0xfffffff3;
  local_70 = (undefined1  [8])0x0;
  local_98 = (Value *)0x0;
  bVar3 = CSEOptimize(this,this->currentBlock,pInstr,pSrc1Val,&local_98,(Value **)local_70,true);
  if (!bVar3) {
    pIVar18 = *pInstr;
    OVar1 = pIVar18->m_opcode;
    if (this->prePassLoop == (Loop *)0x0) {
      pIVar18->m_opcode = OVar22;
    }
    if (bVar4 == false) {
      src1OriginalVal = *pSrc1Val;
    }
    ToInt32(this,pIVar18,pIVar18->m_src1,this->currentBlock,src1OriginalVal,(IndirOpnd *)0x0,bVar4);
    if ((local_40 != BailOutInvalid) && (this->prePassLoop == (Loop *)0x0)) {
      GenerateBailAtOperation(this,pInstr,local_40);
    }
    if ((!skipDst) && (pIVar18 = *pInstr, pIVar18->m_dst != (Opnd *)0x0)) {
      if ((char)CannotOverflowBasedOnRelativeBounds.this == '\0') {
        src1Value = *pSrc1Val;
        pVVar14 = (Value *)0x0;
      }
      else {
        if ((this->prePassLoop == (Loop *)0x0) && ((uVar5 != min || (uVar16 != max)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x214a,
                             "(!(isTransfer && !this->IsLoopPrePass()) || min == newMin && max == newMax)"
                             ,"If this is just a copy, old/new min/max should be the same");
          if (!bVar3) {
LAB_00437fe8:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar9 = 0;
          pIVar18 = *pInstr;
        }
        pVVar14 = *pSrc1Val;
        src1Value = pVVar14;
      }
      addSubConstantInfo_00 = (AddSubConstantInfo *)&src2Val;
      if (src2Val == (Value *)0x0) {
        addSubConstantInfo_00 = (AddSubConstantInfo *)0x0;
      }
      TypeSpecializeIntDst
                (this,pIVar18,OVar1,pVVar14,src1Value,(Value *)0x0,local_40,uVar5,uVar16,
                 (Value **)addSubConstantInfo._16_8_,addSubConstantInfo_00);
    }
    uVar7 = Func::GetSourceContextId(this->func);
    uVar8 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar7,uVar8);
    if (local_40 == BailOutInvalid) {
      if (bVar3) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Type specialized to INT\n");
        Output::Flush();
      }
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,AggressiveIntTypeSpecPhase);
      if (!bVar3) {
        return true;
      }
      Output::Print(L"Type specialized to INT: ");
    }
    else {
      if (bVar3) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"Type specialized to INT with bailout on:\n");
        Output::Flush();
      }
      if ((local_40 >> 10 & 1) != 0) {
        uVar7 = Func::GetSourceContextId(this->func);
        uVar8 = Func::GetLocalFunctionId(this->func);
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar7,uVar8);
        if (bVar3) {
          Output::Print(L"TRACE ");
          if (this->prePassLoop != (Loop *)0x0) {
            Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                          (ulong)(this->prePassLoop->loopNumber - 1));
          }
          Output::Print(L": ");
          Output::Print(L"    Overflow\n");
          Output::Flush();
        }
        bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,AggressiveIntTypeSpecPhase);
        if (bVar3) {
          Output::Print(L"Type specialized to INT with bailout (%S): ","Overflow");
          pcVar13 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
          Output::Print(L"%s \n",pcVar13);
        }
      }
      if (local_40 >> 0xc == 0) {
        return true;
      }
      uVar7 = Func::GetSourceContextId(this->func);
      uVar8 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,uVar7,uVar8);
      if (bVar3) {
        Output::Print(L"TRACE ");
        if (this->prePassLoop != (Loop *)0x0) {
          Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                        (ulong)(this->prePassLoop->loopNumber - 1));
        }
        Output::Print(L": ");
        Output::Print(L"    Zero\n");
        Output::Flush();
      }
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,AggressiveIntTypeSpecPhase);
      if (!bVar3) {
        return true;
      }
      Output::Print(L"Type specialized to INT with bailout (%S): ","Zero");
    }
    pcVar13 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
    Output::Print(L"%s \n",pcVar13);
    return true;
  }
  *redoTypeSpecRef = true;
switchD_00437390_caseD_24:
  return false;
}

Assistant:

bool
GlobOpt::TypeSpecializeIntUnary(
    IR::Instr **pInstr,
    Value **pSrc1Val,
    Value **pDstVal,
    int32 min,
    int32 max,
    Value *const src1OriginalVal,
    bool *redoTypeSpecRef,
    bool skipDst /* = false */)
{
    IR::Instr *&instr = *pInstr;

    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;

    bool isTransfer = false;
    Js::OpCode opcode;
    int32 newMin, newMax;
    bool lossy = false;
    IR::BailOutKind bailOutKind = IR::BailOutInvalid;
    bool ignoredIntOverflow = this->ignoredIntOverflowForCurrentInstr;
    bool ignoredNegativeZero = false;
    bool checkTypeSpecWorth = false;

    if(instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym->m_isNotNumber)
    {
        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
    }

    AddSubConstantInfo addSubConstantInfo;

    switch(instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
            if (CurrentBlockData()->IsInt32TypeSpecialized(sym) == false)
            {
                // Type specializing an Ld_A isn't worth it, unless the src
                // is already type specialized.
                return false;
            }
        }
        newMin = min;
        newMax = max;
        opcode = Js::OpCode::Ld_I4;
        isTransfer = true;
        break;

    case Js::OpCode::Conv_Num:
        newMin = min;
        newMax = max;
        opcode = Js::OpCode::Ld_I4;
        isTransfer = true;
        break;

    case Js::OpCode::LdC_A_I4:
        newMin = newMax = instr->GetSrc1()->AsIntConstOpnd()->AsInt32();
        opcode = Js::OpCode::Ld_I4;
        break;

    case Js::OpCode::Neg_A:
        if (min <= 0 && max >= 0)
        {
            if(instr->ShouldCheckForNegativeZero())
            {
                // -0 matters since the sym is not a local, or is used in a way in which -0 would differ from +0
                if(!DoAggressiveIntTypeSpec())
                {
                    // May result in -0
                    // Consider adding a dynamic check for src1 == 0
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                if(min == 0 && max == 0)
                {
                    // Always results in -0
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnNegativeZero;
            }
            else
            {
                ignoredNegativeZero = true;
            }
        }
        if (Int32Math::Neg(min, &newMax))
        {
            if(instr->ShouldCheckForIntOverflow())
            {
                if(!DoAggressiveIntTypeSpec())
                {
                    // May overflow
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                if(min == max)
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnOverflow;
                newMax = INT32_MAX;
            }
            else
            {
                ignoredIntOverflow = true;
            }
        }
        if (Int32Math::Neg(max, &newMin))
        {
            if(instr->ShouldCheckForIntOverflow())
            {
                if(!DoAggressiveIntTypeSpec())
                {
                    // May overflow
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnOverflow;
                newMin = INT32_MAX;
            }
            else
            {
                ignoredIntOverflow = true;
            }
        }
        if(!instr->ShouldCheckForIntOverflow() && newMin > newMax)
        {
            // When ignoring overflow, the range needs to account for overflow. Since MIN_INT is the only int32 value that
            // overflows on Neg, and the value resulting from overflow is also MIN_INT, if calculating only the new min or new
            // max overflowed but not both, then the new min will be greater than the new max. In that case we need to consider
            // the full range of int32s as possible resulting values.
            newMin = INT32_MIN;
            newMax = INT32_MAX;
        }
        opcode = Js::OpCode::Neg_I4;
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::Not_A:
        if(!DoLossyIntTypeSpec())
        {
            return false;
        }
        this->PropagateIntRangeForNot(min, max, &newMin, &newMax);
        opcode = Js::OpCode::Not_I4;
        lossy = true;
        break;

    case Js::OpCode::Incr_A:
        do // while(false)
        {
            const auto CannotOverflowBasedOnRelativeBounds = [&]()
            {
                const ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
                return
                    (src1ValueInfo->IsInt() || DoAggressiveIntTypeSpec()) &&
                    src1ValueInfo->IsIntBounded() &&
                    src1ValueInfo->AsIntBounded()->Bounds()->AddCannotOverflowBasedOnRelativeBounds(1);
            };

            if (Int32Math::Inc(min, &newMin))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMin = INT32_MAX;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                else
                {
                    // When ignoring overflow, the range needs to account for overflow. For any Add or Sub, since overflow
                    // causes the value to wrap around, and we don't have a way to specify a lower and upper range of ints,
                    // we use the full range of int32s.
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
            if (Int32Math::Inc(max, &newMax))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMax = INT32_MAX;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    if(!DoAggressiveIntTypeSpec())
                    {
                        // May overflow
                        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                    }
                    bailOutKind |= IR::BailOutOnOverflow;
                    newMax = INT32_MAX;
                }
                else
                {
                    // See comment about ignoring overflow above
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
        } while(false);

        if(!ignoredIntOverflow && instr->GetSrc1()->IsRegOpnd())
        {
            addSubConstantInfo.Set(instr->GetSrc1()->AsRegOpnd()->m_sym, src1Val, min == max, 1);
        }

        opcode = Js::OpCode::Add_I4;
        if (!this->IsLoopPrePass())
        {
            instr->SetSrc2(IR::IntConstOpnd::New(1, TyInt32, instr->m_func));
        }
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::Decr_A:
        do // while(false)
        {
            const auto CannotOverflowBasedOnRelativeBounds = [&]()
            {
                const ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
                return
                    (src1ValueInfo->IsInt() || DoAggressiveIntTypeSpec()) &&
                    src1ValueInfo->IsIntBounded() &&
                    src1ValueInfo->AsIntBounded()->Bounds()->SubCannotOverflowBasedOnRelativeBounds(1);
            };

            if (Int32Math::Dec(max, &newMax))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMax = INT32_MIN;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                else
                {
                    // When ignoring overflow, the range needs to account for overflow. For any Add or Sub, since overflow
                    // causes the value to wrap around, and we don't have a way to specify a lower and upper range of ints, we
                    // use the full range of int32s.
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
            if (Int32Math::Dec(min, &newMin))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMin = INT32_MIN;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    if(!DoAggressiveIntTypeSpec())
                    {
                        // May overflow
                        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                    }
                    bailOutKind |= IR::BailOutOnOverflow;
                    newMin = INT32_MIN;
                }
                else
                {
                    // See comment about ignoring overflow above
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
        } while(false);

        if(!ignoredIntOverflow && instr->GetSrc1()->IsRegOpnd())
        {
            addSubConstantInfo.Set(instr->GetSrc1()->AsRegOpnd()->m_sym, src1Val, min == max, -1);
        }

        opcode = Js::OpCode::Sub_I4;
        if (!this->IsLoopPrePass())
        {
            instr->SetSrc2(IR::IntConstOpnd::New(1, TyInt32, instr->m_func));
        }
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::BrFalse_A:
    case Js::OpCode::BrTrue_A:
    {
        if(DoConstFold() && !IsLoopPrePass() && TryOptConstFoldBrFalse(instr, src1Val, min, max))
        {
            return true;
        }

        bool specialize = true;
        if (!src1Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc1()->IsRegOpnd())
        {
            StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
            if (CurrentBlockData()->IsInt32TypeSpecialized(sym) == false)
            {
                // Type specializing a BrTrue_A/BrFalse_A isn't worth it, unless the src
                // is already type specialized
                specialize = false;
            }
        }
        if(instr->m_opcode == Js::OpCode::BrTrue_A)
        {
            UpdateIntBoundsForNotEqualBranch(src1Val, nullptr, 0);
            opcode = Js::OpCode::BrTrue_I4;
        }
        else
        {
            UpdateIntBoundsForEqualBranch(src1Val, nullptr, 0);
            opcode = Js::OpCode::BrFalse_I4;
        }
        if(!specialize)
        {
            return false;
        }

        newMin = 2; newMax = 1;  // We'll assert if we make a range where min > max
        break;
    }

    case Js::OpCode::MultiBr:
        newMin = min;
        newMax = max;
        opcode = instr->m_opcode;
        break;

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::StElemC:
        if(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyAnyArrayWithNativeFloatValues())
        {
            src1Val = src1OriginalVal;
        }
        return TypeSpecializeStElem(pInstr, src1Val, pDstVal);

    case Js::OpCode::NewScArray:
    case Js::OpCode::NewScArrayWithMissingValues:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
#if !FLOATVAR
    case Js::OpCode::StSlotBoxTemp:
#endif
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_FixupForStackArgs:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_SpreadArg:
    // For this one we need to implement type specialization
    //case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::Ret:
    case Js::OpCode::LdElemUndef:
    case Js::OpCode::LdElemUndefScoped:
        return false;

    default:
        if (OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
        {
            newMin = min;
            newMax = max;
            opcode = instr->m_opcode;
            break; // Note: we must keep checkTypeSpecWorth = false to make sure we never return false from this function.
        }
        return false;
    }

    // If this instruction is in a range of instructions where int overflow does not matter, we will still specialize it (won't
    // leave it unspecialized based on heuristics), since it is most likely worth specializing, and the dst value needs to be
    // guaranteed to be an int
    if(checkTypeSpecWorth &&
        !ignoredIntOverflow &&
        !ignoredNegativeZero &&
        instr->ShouldCheckForIntOverflow() &&
        !IsWorthSpecializingToInt32(instr, src1Val))
    {
        // Even though type specialization is being skipped since it may not be worth it, the proper value should still be
        // maintained so that the result may be type specialized later. An int value is not created for the dst in any of
        // the following cases.
        // - A bailout check is necessary to specialize this instruction. The bailout check is what guarantees the result to be
        //   an int, but since we're not going to specialize this instruction, there won't be a bailout check.
        // - Aggressive int type specialization is disabled and we're in a loop prepass. We're conservative on dst values in
        //   that case, especially if the dst sym is live on the back-edge.
        if(bailOutKind == IR::BailOutInvalid &&
            instr->GetDst() &&
            (DoAggressiveIntTypeSpec() || !this->IsLoopPrePass()))
        {
            *pDstVal = CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, nullptr);
        }

        if(instr->GetSrc2())
        {
            instr->FreeSrc2();
        }
        return false;
    }

    this->ignoredIntOverflowForCurrentInstr = ignoredIntOverflow;
    this->ignoredNegativeZeroForCurrentInstr = ignoredNegativeZero;

    {
        // Try CSE again before modifying the IR, in case some attributes are required for successful CSE
        Value *src1IndirIndexVal = nullptr;
        Value *src2Val = nullptr;
        if(CSEOptimize(currentBlock, &instr, &src1Val, &src2Val, &src1IndirIndexVal, true /* intMathExprOnly */))
        {
            *redoTypeSpecRef = true;
            return false;
        }
    }

    const Js::OpCode originalOpCode = instr->m_opcode;
    if (!this->IsLoopPrePass())
    {
        // No re-write on prepass
        instr->m_opcode = opcode;
    }

    Value *src1ValueToSpecialize = src1Val;
    if(lossy)
    {
        // Lossy conversions to int32 must be done based on the original source values. For instance, if one of the values is a
        // float constant with a value that fits in a uint32 but not an int32, and the instruction can ignore int overflow, the
        // source value for the purposes of int specialization would have been changed to an int constant value by ignoring
        // overflow. If we were to specialize the sym using the int constant value, it would be treated as a lossless
        // conversion, but since there may be subsequent uses of the same float constant value that may not ignore overflow,
        // this must be treated as a lossy conversion by specializing the sym using the original float constant value.
        src1ValueToSpecialize = src1OriginalVal;
    }

    // Make sure the srcs are specialized
    IR::Opnd *src1 = instr->GetSrc1();
    this->ToInt32(instr, src1, this->currentBlock, src1ValueToSpecialize, nullptr, lossy);

    if(bailOutKind != IR::BailOutInvalid && !this->IsLoopPrePass())
    {
        GenerateBailAtOperation(&instr, bailOutKind);
    }

    if (!skipDst)
    {
        IR::Opnd *dst = instr->GetDst();
        if (dst)
        {
            AssertMsg(!(isTransfer && !this->IsLoopPrePass()) || min == newMin && max == newMax, "If this is just a copy, old/new min/max should be the same");
            TypeSpecializeIntDst(
                instr,
                originalOpCode,
                isTransfer ? src1Val : nullptr,
                src1Val,
                nullptr,
                bailOutKind,
                newMin,
                newMax,
                pDstVal,
                addSubConstantInfo.HasInfo() ? &addSubConstantInfo : nullptr);
        }
    }

    if(bailOutKind == IR::BailOutInvalid)
    {
        GOPT_TRACE(_u("Type specialized to INT\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
        {
            Output::Print(_u("Type specialized to INT: "));
            Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
        }
#endif
    }
    else
    {
        GOPT_TRACE(_u("Type specialized to INT with bailout on:\n"));
        if(bailOutKind & IR::BailOutOnOverflow)
        {
            GOPT_TRACE(_u("    Overflow\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
            {
                Output::Print(_u("Type specialized to INT with bailout (%S): "), "Overflow");
                Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
            }
#endif
        }
        if(bailOutKind & IR::BailOutOnNegativeZero)
        {
            GOPT_TRACE(_u("    Zero\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
            {
                Output::Print(_u("Type specialized to INT with bailout (%S): "), "Zero");
                Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
            }
#endif
        }
    }

    return true;
}